

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O0

void Mpm_ManPrintStats(Mpm_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  abctime aVar7;
  double local_a8;
  double local_98;
  double local_88;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  Mpm_Man_t *p_local;
  
  iVar1 = Mig_ManObjNum(p->pMig);
  iVar2 = Mig_ManObjNum(p->pMig);
  iVar3 = Mmr_StepMemory(p->pManCuts);
  iVar4 = Mig_ManObjNum(p->pMig);
  iVar5 = Mig_ManObjNum(p->pMig);
  iVar6 = Mmr_StepMemory(p->pManCuts);
  printf("Memory usage:  Mig = %.2f MB  Map = %.2f MB  Cut = %.2f MB    Total = %.2f MB.  ",
         ((double)iVar1 * 1.0 * 16.0) / 1048576.0,((double)iVar2 * 1.0 * 48.0) / 1048576.0,
         ((double)iVar3 * 1.0) / 131072.0,
         ((double)iVar4 * 1.0 * 16.0) / 1048576.0 + ((double)iVar5 * 1.0 * 48.0) / 1048576.0 +
         ((double)iVar6 * 1.0) / 131072.0);
  if (p->timeDerive == 0) {
    aVar7 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar7 - p->timeTotal);
  }
  else {
    printf("\n");
    aVar7 = Abc_Clock();
    p->timeTotal = aVar7 - p->timeTotal;
    p->timeOther = p->timeTotal - p->timeDerive;
    Abc_Print(1,"Runtime breakdown:\n");
    Abc_Print(1,"%s =","Complete cut computation   ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_48 = ((double)p->timeDerive * 100.0) / (double)p->timeTotal;
    }
    else {
      local_48 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeDerive * 1.0) / 1000000.0,local_48);
    Abc_Print(1,"%s =","- Merging cuts             ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_58 = ((double)p->timeMerge * 100.0) / (double)p->timeTotal;
    }
    else {
      local_58 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeMerge * 1.0) / 1000000.0,local_58);
    Abc_Print(1,"%s =","- Evaluting cut parameters ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_68 = ((double)p->timeEval * 100.0) / (double)p->timeTotal;
    }
    else {
      local_68 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeEval * 1.0) / 1000000.0,local_68);
    Abc_Print(1,"%s =","- Checking cut containment ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_78 = ((double)p->timeCompare * 100.0) / (double)p->timeTotal;
    }
    else {
      local_78 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeCompare * 1.0) / 1000000.0,local_78);
    Abc_Print(1,"%s =","- Adding cuts to storage   ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_88 = ((double)p->timeStore * 100.0) / (double)p->timeTotal;
    }
    else {
      local_88 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeStore * 1.0) / 1000000.0,local_88);
    Abc_Print(1,"%s =","Other                      ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_98 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    else {
      local_98 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOther * 1.0) / 1000000.0,local_98);
    Abc_Print(1,"%s =","TOTAL                      ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_a8 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
    }
    else {
      local_a8 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_a8);
  }
  return;
}

Assistant:

void Mpm_ManPrintStats( Mpm_Man_t * p )
{
    printf( "Memory usage:  Mig = %.2f MB  Map = %.2f MB  Cut = %.2f MB    Total = %.2f MB.  ", 
        1.0 * Mig_ManObjNum(p->pMig) * sizeof(Mig_Obj_t) / (1 << 20), 
        1.0 * Mig_ManObjNum(p->pMig) * 48 / (1 << 20), 
        1.0 * Mmr_StepMemory(p->pManCuts) / (1 << 17), 
        1.0 * Mig_ManObjNum(p->pMig) * sizeof(Mig_Obj_t) / (1 << 20) + 
        1.0 * Mig_ManObjNum(p->pMig) * 48 / (1 << 20) +
        1.0 * Mmr_StepMemory(p->pManCuts) / (1 << 17) );
    if ( p->timeDerive )
    {
        printf( "\n" );
        p->timeTotal = Abc_Clock() - p->timeTotal;
        p->timeOther = p->timeTotal - p->timeDerive;

        Abc_Print( 1, "Runtime breakdown:\n" );
        ABC_PRTP( "Complete cut computation   ", p->timeDerive , p->timeTotal );
        ABC_PRTP( "- Merging cuts             ", p->timeMerge  , p->timeTotal );
        ABC_PRTP( "- Evaluting cut parameters ", p->timeEval   , p->timeTotal );
        ABC_PRTP( "- Checking cut containment ", p->timeCompare, p->timeTotal );
        ABC_PRTP( "- Adding cuts to storage   ", p->timeStore  , p->timeTotal );
        ABC_PRTP( "Other                      ", p->timeOther  , p->timeTotal );
        ABC_PRTP( "TOTAL                      ", p->timeTotal  , p->timeTotal );
    }
    else
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->timeTotal );
}